

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O0

void ctemplate_htmlparser::statemachine_encode_char(char schr,char *output,size_t len)

{
  uchar chr;
  size_t len_local;
  char *output_local;
  char schr_local;
  
  if (schr == '\'') {
    strncpy(output,"\\\'",len);
  }
  else if (schr == '\\') {
    strncpy(output,"\\\\",len);
  }
  else if (((byte)schr < 0x20) || (0x7e < (byte)schr)) {
    if (schr == '\n') {
      strncpy(output,"\\n",len);
    }
    else if (schr == '\r') {
      strncpy(output,"\\r",len);
    }
    else if (schr == '\t') {
      strncpy(output,"\\t",len);
    }
    else {
      snprintf(output,len,"\\x%.2x",(ulong)(byte)schr);
    }
  }
  else {
    snprintf(output,len,"%c",(ulong)(byte)schr);
  }
  output[len - 1] = '\0';
  return;
}

Assistant:

void statemachine_encode_char(char schr, char *output, size_t len)
{
  unsigned char chr = schr;
  if (chr == '\'') {
    strncpy(output, "\\'", len);
  } else if (chr == '\\') {
    strncpy(output, "\\\\", len);

  /* Like isprint() but not dependent on locale. */
  } else if (chr >= 32 && chr <= 126) {
    snprintf(output, len, "%c", chr);
  } else if (chr == '\n') {
    strncpy(output, "\\n", len);
  } else if (chr == '\r') {
    strncpy(output, "\\r", len);
  } else if (chr == '\t') {
    strncpy(output, "\\t", len);
  } else {
    snprintf(output, len, "\\x%.2x", chr);
  }

  output[len - 1] = '\0';
}